

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O2

FxExpression * __thiscall FxFloatCast::Resolve(FxFloatCast *this,FCompileContext *ctx)

{
  PType *pPVar1;
  PName *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  FxConstant *pFVar5;
  long lVar6;
  FxExpression *x;
  double val;
  ExpVal constval;
  FxExpression *pFVar4;
  
  if ((this->super_FxExpression).isresolved == false) {
    (this->super_FxExpression).isresolved = true;
    if (this->basex != (FxExpression *)0x0) {
      iVar3 = (*this->basex->_vptr_FxExpression[2])();
      pFVar4 = (FxExpression *)CONCAT44(extraout_var,iVar3);
      this->basex = pFVar4;
      if (pFVar4 != (FxExpression *)0x0) {
        iVar3 = (*(pFVar4->ValueType->super_DObject)._vptr_DObject[0x12])();
        pFVar5 = (FxConstant *)this->basex;
        if (iVar3 == 1) {
          this->basex = (FxExpression *)0x0;
        }
        else {
          iVar3 = (*(((pFVar5->super_FxExpression).ValueType)->super_DObject)._vptr_DObject[0x12])()
          ;
          pPVar2 = TypeName;
          if (iVar3 == 0) {
            pPVar1 = this->basex->ValueType;
            iVar3 = (*this->basex->_vptr_FxExpression[3])();
            if (pPVar1 != (PType *)pPVar2) {
              if ((char)iVar3 == '\0') {
                return &this->super_FxExpression;
              }
              ExpVal::ExpVal(&constval,(ExpVal *)(this->basex + 1));
              pFVar5 = (FxConstant *)operator_new(0x48);
              val = ExpVal::GetFloat(&constval);
              FxConstant::FxConstant(pFVar5,val,&(this->super_FxExpression).ScriptPosition);
              (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
              ExpVal::~ExpVal(&constval);
              return &pFVar5->super_FxExpression;
            }
            if ((char)iVar3 == '\0') {
              FScriptPosition::Message
                        (&(this->super_FxExpression).ScriptPosition,3,
                         "Numeric type expected, got a name");
            }
            else {
              ExpVal::ExpVal(&constval,(ExpVal *)(this->basex + 1));
              lVar6 = (long)constval.field_1.Int;
              if (constval.Type != (PType *)TypeName) {
                lVar6 = 0;
              }
              FScriptPosition::Message
                        (&(this->super_FxExpression).ScriptPosition,3,
                         "Numeric type expected, got \"%s\"",FName::NameData.NameArray[lVar6].Text);
              ExpVal::~ExpVal(&constval);
            }
            pFVar5 = (FxConstant *)operator_new(0x48);
            FxConstant::FxConstant(pFVar5,0.0,&(this->super_FxExpression).ScriptPosition);
          }
          else {
            pFVar5 = (FxConstant *)0x0;
            FScriptPosition::Message
                      (&(this->super_FxExpression).ScriptPosition,2,"Numeric type expected");
          }
        }
        (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
        return &pFVar5->super_FxExpression;
      }
    }
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    this = (FxFloatCast *)0x0;
  }
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxFloatCast::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(basex, ctx);

	if (basex->ValueType->GetRegType() == REGT_FLOAT)
	{
		FxExpression *x = basex;
		basex = NULL;
		delete this;
		return x;
	}
	else if (basex->ValueType->GetRegType() == REGT_INT)
	{
		if (basex->ValueType != TypeName)
		{
			if (basex->isConstant())
			{
				ExpVal constval = static_cast<FxConstant *>(basex)->GetValue();
				FxExpression *x = new FxConstant(constval.GetFloat(), ScriptPosition);
				delete this;
				return x;
			}
			return this;
		}
		else
		{
			// Ugh. This should abort, but too many mods fell into this logic hole somewhere, so this seroious error needs to be reduced to a warning. :(
			if (!basex->isConstant()) ScriptPosition.Message(MSG_OPTERROR, "Numeric type expected, got a name");
			else ScriptPosition.Message(MSG_OPTERROR, "Numeric type expected, got \"%s\"", static_cast<FxConstant*>(basex)->GetValue().GetName().GetChars());
			FxExpression *x = new FxConstant(0.0, ScriptPosition);
			delete this;
			return x;
		}
	}
	else
	{
		ScriptPosition.Message(MSG_ERROR, "Numeric type expected");
		delete this;
		return NULL;
	}
}